

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

uint64_t helper_clfxb(CPUS390XState_conflict *env,uint64_t h,uint64_t l,uint32_t m34)

{
  float128 a;
  byte bVar1;
  _Bool XxC;
  int old_mode_00;
  uint32_t uVar2;
  uintptr_t unaff_retaddr;
  uint32_t ret;
  int old_mode;
  uint32_t m34_local;
  uint64_t l_local;
  uint64_t h_local;
  CPUS390XState_conflict *env_local;
  
  bVar1 = round_from_m34(m34);
  old_mode_00 = s390_swap_bfp_rounding_mode(env,(uint)bVar1);
  a.high = h;
  a.low = l;
  uVar2 = float128_to_uint32_s390x(a,&env->fpu_status);
  s390_restore_bfp_rounding_mode(env,old_mode_00);
  XxC = xxc_from_m34(m34);
  handle_exceptions(env,XxC,unaff_retaddr);
  return (ulong)uVar2;
}

Assistant:

uint64_t HELPER(clfxb)(CPUS390XState *env, uint64_t h, uint64_t l, uint32_t m34)
{
    int old_mode = s390_swap_bfp_rounding_mode(env, round_from_m34(m34));
    uint32_t ret = float128_to_uint32(make_float128(h, l), &env->fpu_status);

    s390_restore_bfp_rounding_mode(env, old_mode);
    handle_exceptions(env, xxc_from_m34(m34), GETPC());
    return ret;
}